

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher_erk.c
# Opt level: O0

char * ARKodeButcherTable_ERKIDToName(ARKODE_ERKTableID emethod)

{
  int in_EDI;
  char *local_8;
  
  if (in_EDI + 1U < 0x19 || in_EDI == 0x18) {
    switch((long)&switchD_001384ff::switchdataD_0019de78 +
           (long)(int)(&switchD_001384ff::switchdataD_0019de78)[in_EDI + 1U]) {
    case 0x138501:
      local_8 = "ARKODE_ERK_NONE";
      break;
    case 0x138512:
      local_8 = "ARKODE_FORWARD_EULER_1_1";
      break;
    case 0x138523:
      local_8 = "ARKODE_HEUN_EULER_2_1_2";
      break;
    case 0x138534:
      local_8 = "ARKODE_RALSTON_EULER_2_1_2";
      break;
    case 0x138545:
      local_8 = "ARKODE_EXPLICIT_MIDPOINT_EULER_2_1_2";
      break;
    case 0x138556:
      local_8 = "ARKODE_ARK2_ERK_3_1_2";
      break;
    case 0x138567:
      local_8 = "ARKODE_BOGACKI_SHAMPINE_4_2_3";
      break;
    case 0x138578:
      local_8 = "ARKODE_ARK324L2SA_ERK_4_2_3";
      break;
    case 0x138589:
      local_8 = "ARKODE_SHU_OSHER_3_2_3";
      break;
    case 0x13859a:
      local_8 = "ARKODE_SOFRONIOU_SPALETTA_5_3_4";
      break;
    case 0x1385ab:
      local_8 = "ARKODE_ZONNEVELD_5_3_4";
      break;
    case 0x1385bc:
      local_8 = "ARKODE_ARK436L2SA_ERK_6_3_4";
      break;
    case 0x1385cd:
      local_8 = "ARKODE_ARK437L2SA_ERK_7_3_4";
      break;
    case 0x1385de:
      local_8 = "ARKODE_SAYFY_ABURUB_6_3_4";
      break;
    case 0x1385ef:
      local_8 = "ARKODE_CASH_KARP_6_4_5";
      break;
    case 0x138600:
      local_8 = "ARKODE_FEHLBERG_6_4_5";
      break;
    case 0x138611:
      local_8 = "ARKODE_DORMAND_PRINCE_7_4_5";
      break;
    case 0x138622:
      local_8 = "ARKODE_ARK548L2SA_ERK_8_4_5";
      break;
    case 0x138633:
      local_8 = "ARKODE_ARK548L2SAb_ERK_8_4_5";
      break;
    case 0x138644:
      local_8 = "ARKODE_VERNER_8_5_6";
      break;
    case 0x138655:
      local_8 = "ARKODE_VERNER_9_5_6";
      break;
    case 0x138663:
      local_8 = "ARKODE_VERNER_10_6_7";
      break;
    case 0x138671:
      local_8 = "ARKODE_VERNER_13_7_8";
      break;
    case 0x13867f:
      local_8 = "ARKODE_VERNER_16_8_9";
      break;
    case 0x13868d:
      local_8 = "ARKODE_FEHLBERG_13_7_8";
      break;
    case 0x13869b:
      local_8 = "ARKODE_KNOTH_WOLKE_3_3";
    }
  }
  else {
    arkProcessError((ARKodeMem)0x0,-0x16,0x49,"ARKodeButcherTable_ERKIDToName",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_butcher_erk.c"
                    ,"Unknown Butcher table");
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* ARKodeButcherTable_ERKIDToName(ARKODE_ERKTableID emethod)
{
  /* Use X-macro to test each method name */
  switch (emethod)
  {
#define ARK_BUTCHER_TABLE(name, coeff) \
  case name: return #name;
#include "arkode_butcher_erk.def"
#undef ARK_BUTCHER_TABLE

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown Butcher table");
    return NULL;
  }
}